

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitonicsort.hpp
# Opt level: O0

void mxx::impl::
     bitonic_merge<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
               (undefined8 begin,undefined8 end,comm *param_3,int param_4,int param_5,
               undefined4 param_6)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  int partner_rank_1;
  int partner_rank;
  int pmid;
  int p2;
  int size;
  int dir_local;
  int pend_local;
  int pbeg_local;
  comm *comm_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin_local;
  
  iVar1 = mxx::comm::rank(param_3);
  if ((iVar1 < param_4) || (iVar1 = mxx::comm::rank(param_3), param_5 <= iVar1)) {
    assert_fail("pbeg <= comm.rank() && comm.rank() < pend",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/bitonicsort.hpp"
                ,0x60,"bitonic_merge");
  }
  if (1 < param_5 - param_4) {
    dVar4 = log((double)(param_5 - param_4));
    dVar5 = log(2.0);
    dVar4 = ceil(dVar4 / dVar5);
    dVar4 = pow(2.0,dVar4);
    iVar1 = (int)dVar4;
    iVar2 = param_4 + iVar1 / 2;
    iVar3 = mxx::comm::rank(param_3);
    if ((iVar3 < iVar2) && (iVar3 = mxx::comm::rank(param_3), iVar3 + iVar1 / 2 < param_5)) {
      iVar3 = mxx::comm::rank(param_3);
      bitonic_split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
                (begin,end,param_3,iVar3 + iVar1 / 2,param_6);
      bitonic_merge<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
                (begin,end,param_3,param_4,iVar2,param_6);
    }
    else {
      iVar3 = mxx::comm::rank(param_3);
      if (iVar3 < iVar2) {
        bitonic_merge<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
                  (begin,end,param_3,param_4,iVar2,param_6);
      }
      else {
        iVar3 = mxx::comm::rank(param_3);
        bitonic_split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
                  (begin,end,param_3,iVar3 - iVar1 / 2,param_6);
        bitonic_merge<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,MxxSort_StableSort_Test::TestBody()::__0>
                  (begin,end,param_3,iVar2,param_5,param_6);
      }
    }
  }
  return;
}

Assistant:

void bitonic_merge(_Iterator begin, _Iterator end, _Compare comp, const mxx::comm& comm, int pbeg, int pend, int dir) {
    MXX_ASSERT(pbeg <= comm.rank() && comm.rank() < pend);

    // get size and terminate at recursive base-case
    int size = pend - pbeg;
    if (size <= 1)
        return;

    // get next greater power of 2
    int p2 = pow(2, ceil(log(size)/log(2)));
    // merge with splits as is done in the power of 2 case
    int pmid = pbeg + p2/2;

    if (comm.rank() < pmid && comm.rank() + p2/2 < pend) {
        // this processor has a partner in the second half
        int partner_rank = comm.rank() + p2/2;
        bitonic_split(begin, end, comp, comm, partner_rank, dir);
        bitonic_merge(begin, end, comp, comm, pbeg, pmid, dir);
    } else if (comm.rank() < pmid) {
        // this process doesn't have a partner but has to recursively
        // participate in the next merge
        bitonic_merge(begin, end, comp, comm, pbeg, pmid, dir);
    } else { // if (comm.rank() >= pmid)
        int partner_rank = comm.rank() - p2/2;
        bitonic_split(begin, end, comp, comm, partner_rank, dir);
        bitonic_merge(begin, end, comp, comm, pmid, pend, dir);
    }
}